

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
spvtools::val::Instruction::Instruction(Instruction *this,spv_parsed_instruction_t *inst)

{
  ushort uVar1;
  uint32_t *puVar2;
  spv_parsed_operand_t *psVar3;
  uint *puVar4;
  spv_parsed_operand_t *psVar5;
  allocator<spv_parsed_operand_t> local_1a;
  allocator<unsigned_int> local_19;
  spv_parsed_instruction_t *local_18;
  spv_parsed_instruction_t *inst_local;
  Instruction *this_local;
  
  puVar4 = inst->words;
  puVar2 = inst->words;
  uVar1 = inst->num_words;
  local_18 = inst;
  inst_local = (spv_parsed_instruction_t *)this;
  std::allocator<unsigned_int>::allocator(&local_19);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,puVar4,
             puVar2 + (int)(uint)uVar1,&local_19);
  std::allocator<unsigned_int>::~allocator(&local_19);
  psVar5 = local_18->operands;
  psVar3 = local_18->operands;
  uVar1 = local_18->num_operands;
  std::allocator<spv_parsed_operand_t>::allocator(&local_1a);
  std::vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>>::
  vector<spv_parsed_operand_t_const*,void>
            ((vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>> *)&this->operands_,
             psVar5,psVar3 + (int)(uint)uVar1,&local_1a);
  std::allocator<spv_parsed_operand_t>::~allocator(&local_1a);
  puVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&this->words_);
  (this->inst_).words = puVar4;
  (this->inst_).num_words = local_18->num_words;
  (this->inst_).opcode = local_18->opcode;
  (this->inst_).ext_inst_type = local_18->ext_inst_type;
  (this->inst_).type_id = local_18->type_id;
  (this->inst_).result_id = local_18->result_id;
  psVar5 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::data
                     (&this->operands_);
  (this->inst_).operands = psVar5;
  (this->inst_).num_operands = local_18->num_operands;
  this->line_num_ = 0;
  this->function_ = (Function *)0x0;
  this->block_ = (BasicBlock *)0x0;
  std::
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  ::vector(&this->uses_);
  return;
}

Assistant:

Instruction::Instruction(const spv_parsed_instruction_t* inst)
    : words_(inst->words, inst->words + inst->num_words),
      operands_(inst->operands, inst->operands + inst->num_operands),
      inst_({words_.data(), inst->num_words, inst->opcode, inst->ext_inst_type,
             inst->type_id, inst->result_id, operands_.data(),
             inst->num_operands}) {}